

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O3

KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> * __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_3UL,_void>
::next(KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>
       *__return_storage_ptr__,
      InputIterator<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_3UL,_void>
      *this)

{
  istream *is;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> local_28;
  bool local_20;
  
  this->index_ = this->index_ + 1;
  is = (istream *)
       (*(code *)**(undefined8 **)
                   (this->input_)._M_t.
                   super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
                   .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl)();
  std::istream::read((char *)is,(long)__return_storage_ptr__);
  DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void>::deserialize
            ((DeserializeHelper<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_void> *)
             &local_28,is);
  (__return_storage_ptr__->value).value.data_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false> =
       local_28.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (__return_storage_ptr__->value).removed = local_20;
  return __return_storage_ptr__;
}

Assistant:

T next() {
        ++index_;
        return deserialize<T>(input_->get());
    }